

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void Curl_hash_clean(curl_hash *h)

{
  curl_llist **ppcVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; ppcVar1 = h->table, lVar2 < h->slots; lVar2 = lVar2 + 1) {
    Curl_llist_destroy(ppcVar1[lVar2],h);
    h->table[lVar2] = (curl_llist *)0x0;
  }
  if (ppcVar1 != (curl_llist **)0x0) {
    (*Curl_cfree)(ppcVar1);
    h->table = (curl_llist **)0x0;
  }
  h->size = 0;
  h->slots = 0;
  return;
}

Assistant:

void
Curl_hash_clean(struct curl_hash *h)
{
  int i;

  for(i = 0; i < h->slots; ++i) {
    Curl_llist_destroy(h->table[i], (void *) h);
    h->table[i] = NULL;
  }

  Curl_safefree(h->table);
  h->size = 0;
  h->slots = 0;
}